

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void displayMessage(MessageType t,ostringstream *msg)

{
  bool bVar1;
  ostream *poVar2;
  int in_ECX;
  string stack;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (t == AUTHOR_ERROR) {
    std::operator<<((ostream *)msg,
                    "This error is for project developers. Use -Wno-error=dev to suppress it.");
    std::operator<<((ostream *)msg,"\n");
  }
  else {
    if (t == AUTHOR_WARNING) {
      std::operator<<((ostream *)msg,
                      "This warning is for project developers.  Use -Wno-dev to suppress it.");
      std::operator<<((ostream *)msg,"\n");
LAB_0037a443:
      std::__cxx11::stringbuf::str();
      cmSystemTools::Message(stack._M_dataplus._M_p,"Warning");
      goto LAB_0037a4af;
    }
    std::operator<<((ostream *)msg,"\n");
    if ((t != FATAL_ERROR) && (t != DEPRECATION_ERROR)) {
      if (t != INTERNAL_ERROR) goto LAB_0037a443;
      cmsys::SystemInformation::GetProgramStack_abi_cxx11_(&stack,(SystemInformation *)0x0,0,in_ECX)
      ;
      if (stack._M_string_length != 0) {
        bVar1 = cmHasLiteralPrefix<std::__cxx11::string,9ul>(&stack,(char (*) [9])"WARNING:");
        if (bVar1) {
          std::__cxx11::string::substr((ulong)&local_58,(ulong)&stack);
          std::operator+(&local_38,"Note:",&local_58);
          std::__cxx11::string::operator=((string *)&stack,(string *)&local_38);
          std::__cxx11::string::~string((string *)&local_38);
          std::__cxx11::string::~string((string *)&local_58);
        }
        poVar2 = std::operator<<((ostream *)msg,(string *)&stack);
        std::operator<<(poVar2,"\n");
      }
      std::__cxx11::string::~string((string *)&stack);
    }
  }
  cmSystemTools::s_ErrorOccured = true;
  std::__cxx11::stringbuf::str();
  cmSystemTools::Message(stack._M_dataplus._M_p,"Error");
LAB_0037a4af:
  std::__cxx11::string::~string((string *)&stack);
  return;
}

Assistant:

void displayMessage(cmake::MessageType t, std::ostringstream& msg)
{

  // Add a note about warning suppression.
  if(t == cmake::AUTHOR_WARNING)
    {
    msg <<
      "This warning is for project developers.  Use -Wno-dev to suppress it.";
    }
  else if (t == cmake::AUTHOR_ERROR)
    {
    msg <<
      "This error is for project developers. Use -Wno-error=dev to suppress "
      "it.";
    }

  // Add a terminating blank line.
  msg << "\n";

#if defined(CMAKE_BUILD_WITH_CMAKE)
  // Add a C++ stack trace to internal errors.
  if(t == cmake::INTERNAL_ERROR)
    {
    std::string stack = cmsys::SystemInformation::GetProgramStack(0,0);
    if(!stack.empty())
      {
      if(cmHasLiteralPrefix(stack, "WARNING:"))
        {
        stack = "Note:" + stack.substr(8);
        }
      msg << stack << "\n";
      }
    }
#endif

  // Output the message.
  if(t == cmake::FATAL_ERROR
     || t == cmake::INTERNAL_ERROR
     || t == cmake::DEPRECATION_ERROR
     || t == cmake::AUTHOR_ERROR)
    {
    cmSystemTools::SetErrorOccured();
    cmSystemTools::Message(msg.str().c_str(), "Error");
    }
  else
    {
    cmSystemTools::Message(msg.str().c_str(), "Warning");
    }
}